

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O1

void __thiscall TestCase<true>::~TestCase(TestCase<true> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  (this->super_BaseCase)._vptr_BaseCase = (_func_int **)&PTR_run_00112b20;
  pcVar2 = (this->defined_file_)._M_dataplus._M_p;
  paVar1 = &(this->defined_file_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->case_name_)._M_dataplus._M_p;
  paVar1 = &(this->case_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->method_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->method_,(_Any_data *)&this->method_,__destroy_functor);
  }
  return;
}

Assistant:

~TestCase() override = default;